

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O2

uint * Gia_ManTerStateLookup(uint *pState,int nWords,uint **pBins,int nBins)

{
  uint *__s1;
  int iVar1;
  uint **ppuVar2;
  
  iVar1 = Gia_ManTerStateHash(pState,nWords,nBins);
  ppuVar2 = pBins + iVar1;
  while( true ) {
    __s1 = *ppuVar2;
    if (__s1 == (uint *)0x0) {
      return (uint *)0x0;
    }
    iVar1 = bcmp(__s1,pState,(long)nWords * 4);
    if (iVar1 == 0) break;
    ppuVar2 = (uint **)(__s1 + nWords);
  }
  return __s1;
}

Assistant:

unsigned * Gia_ManTerStateLookup( unsigned * pState, int nWords, unsigned ** pBins, int nBins )
{
    unsigned * pEntry;
    int Hash = Gia_ManTerStateHash( pState, nWords, nBins );
    for ( pEntry = pBins[Hash]; pEntry; pEntry = Gia_ManTerStateNext(pEntry, nWords) )
        if ( !memcmp( pEntry, pState, sizeof(unsigned) * nWords ) )
            return pEntry;
    return NULL;
}